

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sessions.c
# Opt level: O2

int cueify_sessions_serialize(cueify_sessions *s,uint8_t *buffer,size_t *size)

{
  byte bVar1;
  
  if (size == (size_t *)0x0 || s == (cueify_sessions *)0x0) {
    return 3;
  }
  *size = 0xc;
  if (buffer != (uint8_t *)0x0) {
    buffer[0] = '\0';
    buffer[1] = '\n';
    buffer[2] = *(uint8_t *)s;
    buffer[3] = *(uint8_t *)((long)s + 1);
    buffer[4] = '\0';
    buffer[5] = '\0';
    bVar1 = *(char *)((long)s + 2) << 4;
    buffer[5] = bVar1;
    buffer[5] = *(byte *)((long)s + 3) & 0xf | bVar1;
    buffer[6] = *(uint8_t *)((long)s + 4);
    buffer[7] = '\0';
    buffer[8] = *(uint8_t *)((long)s + 0xb);
    buffer[9] = *(uint8_t *)((long)s + 10);
    buffer[10] = *(uint8_t *)((long)s + 9);
    buffer[0xb] = *(uint8_t *)(s + 1);
  }
  return 0;
}

Assistant:

int cueify_sessions_serialize(cueify_sessions *s, uint8_t *buffer,
			      size_t *size) {
    cueify_sessions_private *sessions = (cueify_sessions_private *)s;
    uint16_t sessions_length;
    uint8_t *bp;

    if (s == NULL || size == NULL) {
	return CUEIFY_ERR_BADARG;
    }

    sessions_length = 12;
    *size = sessions_length;
    if (buffer == NULL) {
	return CUEIFY_OK;
    } else if (*size < sessions_length) {
	return CUEIFY_ERR_TOOSMALL;
    }

    /* TOC Data Length */
    sessions_length -= 2;
    buffer[0] = sessions_length >> 8;
    buffer[1] = sessions_length & 0xFF;

    /* First Complete Session Number */
    buffer[2] = sessions->first_session_number;
    /* Last Complete Session Number */
    buffer[3] = sessions->last_session_number;

    /* TOC Track Descriptor */
    bp = buffer + 4;
    /* Reserved */
    *bp++ = 0;
    /* ADR */
    *bp = 0;
    *bp |= sessions->track_adr << 4;
    /* CONTROL */
    *bp++ |= sessions->track_control & 0x0F;
    /* First Track Number in Last Complete Session */
    *bp++ = sessions->track_number;
    /* Reserved */
    *bp++ = 0;
    /* Start Address of First Track in Last Session (LBA) */
    *bp++ = sessions->track_lba >> 24;
    *bp++ = (sessions->track_lba >> 16) & 0xFF;
    *bp++ = (sessions->track_lba >> 8) & 0xFF;
    *bp++ = sessions->track_lba & 0xFF;

    return CUEIFY_OK;
}